

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void set_spatial_segment_id
               (CommonModeInfoParams *mi_params,uint8_t *segment_ids,BLOCK_SIZE bsize,int mi_row,
               int mi_col,uint8_t segment_id)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  uint8_t *__s;
  ulong uVar4;
  bool bVar5;
  
  iVar1 = mi_params->mi_cols;
  uVar4 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar2 = iVar1 - mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar4]
      <= iVar1 - mi_col) {
    uVar2 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [uVar4];
  }
  uVar3 = mi_params->mi_rows - mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar4]
      <= (int)uVar3) {
    uVar3 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [uVar4];
  }
  __s = segment_ids + (mi_row * iVar1 + mi_col);
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    memset(__s,(uint)segment_id,(long)(int)uVar2);
    __s = __s + iVar1;
  }
  return;
}

Assistant:

static inline void set_spatial_segment_id(
    const CommonModeInfoParams *const mi_params, uint8_t *segment_ids,
    BLOCK_SIZE bsize, int mi_row, int mi_col, uint8_t segment_id) {
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int ymis = AOMMIN(mi_params->mi_rows - mi_row, bh);

  const int mi_stride = mi_params->mi_cols;

  set_segment_id(segment_ids, mi_offset, xmis, ymis, mi_stride, segment_id);
}